

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawColumnSubClampTranslatedPalCommand::Execute
          (DrawColumnSubClampTranslatedPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  int core_skip;
  int iVar10;
  byte *pbVar11;
  int pass_skip;
  uint uVar12;
  int iVar13;
  uint uVar14;
  
  iVar10 = (this->super_PalColumnCommand).super_DrawerCommand._dest_y;
  iVar1 = *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc;
  iVar13 = thread->pass_end_y - iVar10;
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  if (iVar1 < iVar13) {
    iVar13 = iVar1;
  }
  uVar12 = thread->pass_start_y - iVar10;
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  iVar1 = thread->num_cores;
  iVar10 = (iVar1 - (int)((iVar10 + uVar12) - thread->core) % iVar1) % iVar1;
  uVar8 = (long)(int)((~uVar12 + iVar1 + iVar13) - iVar10) / (long)iVar1;
  uVar9 = uVar8 & 0xffffffff;
  if (0 < (int)uVar8) {
    iVar13 = (this->super_PalColumnCommand)._pitch;
    iVar2 = (this->super_PalColumnCommand)._iscale;
    iVar10 = iVar10 + uVar12;
    pbVar11 = (this->super_PalColumnCommand)._dest + iVar13 * iVar10;
    iVar10 = iVar10 * iVar2 + (this->super_PalColumnCommand)._texturefrac;
    puVar3 = (this->super_PalColumnCommand)._translation;
    puVar4 = (this->super_PalColumnCommand)._colormap;
    puVar5 = (this->super_PalColumnCommand)._source;
    puVar6 = (this->super_PalColumnCommand)._srcblend;
    puVar7 = (this->super_PalColumnCommand)._destblend;
    do {
      uVar14 = (puVar6[puVar4[puVar3[puVar5[iVar10 >> 0x10]]]] | 0x40100400) - puVar7[*pbVar11];
      uVar12 = uVar14 & 0x40100400;
      uVar12 = uVar12 - (uVar12 >> 5) & uVar14 | 0x1f07c1f;
      *pbVar11 = RGB32k.All[uVar12 >> 0xf & uVar12];
      pbVar11 = pbVar11 + iVar13 * iVar1;
      iVar10 = iVar10 + iVar2 * iVar1;
      uVar12 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar12;
    } while (uVar12 != 0);
  }
  return;
}

Assistant:

void DrawColumnSubClampTranslatedPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;
		fixed_t frac;
		fixed_t fracstep;

		count = _count;
		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		const uint8_t *translation = _translation;
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _source;
		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		do
		{
			uint32_t a = (fg2rgb[colormap[translation[source[frac >> FRACBITS]]]] | 0x40100400) - bg2rgb[*dest];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[(a >> 15) & a];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}